

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP.cpp
# Opt level: O0

uint8_t SRUP_MSG::getByteVal(uint64_t ull,uint8_t p)

{
  uint8_t byte_val;
  uint8_t p_local;
  uint64_t ull_local;
  
  if (p < 8) {
    ull_local._7_1_ = (uint8_t)(ull >> ((p & 7) << 3));
  }
  else {
    ull_local._7_1_ = '\0';
  }
  return ull_local._7_1_;
}

Assistant:

uint8_t SRUP_MSG::getByteVal(uint64_t ull, uint8_t p)
{
    // Given that we have a 64-bit value – we only have 8 bits to play with...
    if ((p<0) || (p>7))
        return 0;

    uint8_t byte_val;
    byte_val = ull >> (uint8_t) (8 * p);
    return byte_val;
}